

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::WriteTargets
          (cmExtraKateGenerator *this,cmLocalGenerator *lg,cmGeneratedFileStream *fout)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  char *pcVar5;
  ostream *poVar6;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  string *psVar9;
  long lVar10;
  pointer ppcVar11;
  pointer ppcVar12;
  string currentDir;
  string makeArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objectFileTargets;
  string make;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string fastTarget;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  pointer local_90;
  string local_88;
  _Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_68;
  string local_50;
  
  pcVar1 = lg->Makefile;
  std::__cxx11::string::string((string *)&local_d8,"CMAKE_MAKE_PROGRAM",(allocator *)&local_f8);
  pcVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_d8);
  std::__cxx11::string::string((string *)&local_88,pcVar5,(allocator *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string
            ((string *)&local_f8,"CMAKE_KATE_MAKE_ARGUMENTS",(allocator *)&local_b8);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::__cxx11::string::string((string *)&local_d8,pcVar5,(allocator *)&local_50);
  std::__cxx11::string::~string((string *)&local_f8);
  pcVar5 = cmLocalGenerator::GetBinaryDirectory(lg);
  poVar6 = std::operator<<((ostream *)fout,"\t\"build\": {\n\t\t\"directory\": \"");
  pcVar7 = cmLocalGenerator::GetBinaryDirectory(lg);
  poVar6 = std::operator<<(poVar6,pcVar7);
  std::operator<<(poVar6,"\",\n\t\t\"default_target\": \"all\",\n\t\t\"clean_target\": \"clean\",\n"
                 );
  poVar6 = std::operator<<((ostream *)fout,"\t\t\"build\": \"");
  poVar6 = std::operator<<(poVar6,(string *)&local_88);
  poVar6 = std::operator<<(poVar6," -C \\\"");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,"\\\" ");
  poVar6 = std::operator<<(poVar6,(string *)&local_d8);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,"all\",\n");
  poVar6 = std::operator<<((ostream *)fout,"\t\t\"clean\": \"");
  poVar6 = std::operator<<(poVar6,(string *)&local_88);
  poVar6 = std::operator<<(poVar6," -C \\\"");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,"\\\" ");
  poVar6 = std::operator<<(poVar6,(string *)&local_d8);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,"clean\",\n");
  poVar6 = std::operator<<((ostream *)fout,"\t\t\"quick\": \"");
  poVar6 = std::operator<<(poVar6,(string *)&local_88);
  poVar6 = std::operator<<(poVar6," -C \\\"");
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,"\\\" ");
  poVar6 = std::operator<<(poVar6,(string *)&local_d8);
  poVar6 = std::operator<<(poVar6," ");
  std::operator<<(poVar6,"install\",\n");
  std::operator<<((ostream *)fout,"\t\t\"targets\":[\n");
  std::__cxx11::string::string((string *)&local_f8,"all",(allocator *)&local_50);
  std::__cxx11::string::string((string *)&local_b8,pcVar5,(allocator *)&local_68);
  AppendTarget(this,fout,&local_f8,&local_88,&local_d8,&local_b8,pcVar5);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string((string *)&local_f8,"clean",(allocator *)&local_50);
  std::__cxx11::string::string((string *)&local_b8,pcVar5,(allocator *)&local_68);
  AppendTarget(this,fout,&local_f8,&local_88,&local_d8,&local_b8,pcVar5);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  pcVar8 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  ppcVar11 = (pcVar8->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppcVar11 ==
        (pcVar8->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator<<((ostream *)fout,"\t] }\n");
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_88);
      return;
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_68,
               &(*ppcVar11)->GeneratorTargets);
    pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar11);
    std::__cxx11::string::string((string *)&local_f8,pcVar7,(allocator *)&local_b8);
    local_90 = ppcVar11;
    pcVar7 = cmLocalGenerator::GetBinaryDirectory(*ppcVar11);
    bVar2 = std::operator==(&local_f8,pcVar7);
    for (ppcVar12 = local_68._M_impl.super__Vector_impl_data._M_start;
        ppcVar12 != local_68._M_impl.super__Vector_impl_data._M_finish; ppcVar12 = ppcVar12 + 1) {
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar12);
      std::__cxx11::string::string((string *)&local_b8,(string *)psVar9);
      TVar4 = cmGeneratorTarget::GetType(*ppcVar12);
      if (TVar4 < UTILITY) {
        AppendTarget(this,fout,&local_b8,&local_88,&local_d8,&local_f8,pcVar5);
        std::__cxx11::string::string((string *)&local_50,(string *)&local_b8);
        std::__cxx11::string::append((char *)&local_50);
        AppendTarget(this,fout,&local_50,&local_88,&local_d8,&local_f8,pcVar5);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else if (TVar4 == UTILITY) {
        lVar10 = std::__cxx11::string::find((char *)&local_b8,0x4970a3);
        if (lVar10 == 0) {
          bVar3 = std::operator!=(&local_b8,"Nightly");
          if (bVar3) goto LAB_0034e8f7;
        }
        lVar10 = std::__cxx11::string::find((char *)&local_b8,0x4970ab);
        if (lVar10 == 0) {
          bVar3 = std::operator!=(&local_b8,"Continuous");
          if (bVar3) goto LAB_0034e8f7;
        }
        lVar10 = std::__cxx11::string::find((char *)&local_b8,0x4970b6);
        if (lVar10 == 0) {
          bVar3 = std::operator!=(&local_b8,"Experimental");
          if (bVar3) goto LAB_0034e8f7;
        }
        AppendTarget(this,fout,&local_b8,&local_88,&local_d8,&local_f8,pcVar5);
      }
      else if ((TVar4 == GLOBAL_TARGET) && (bVar2)) {
        bVar3 = std::operator==(&local_b8,"edit_cache");
        if (bVar3) {
          pcVar1 = (*local_90)->Makefile;
          std::__cxx11::string::string((string *)&local_50,"CMAKE_EDIT_COMMAND",&local_f9);
          pcVar7 = cmMakefile::GetDefinition(pcVar1,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (pcVar7 != (char *)0x0) {
            pcVar7 = strstr(pcVar7,"ccmake");
            if (pcVar7 == (char *)0x0) goto LAB_0034e983;
          }
        }
        else {
LAB_0034e983:
          AppendTarget(this,fout,&local_b8,&local_88,&local_d8,&local_f8,pcVar5);
        }
      }
LAB_0034e8f7:
      std::__cxx11::string::~string((string *)&local_b8);
    }
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
              (&local_68);
    ppcVar11 = local_90 + 1;
    pcVar8 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  } while( true );
}

Assistant:

void
cmExtraKateGenerator::WriteTargets(const cmLocalGenerator* lg,
                                   cmGeneratedFileStream& fout) const
{
  cmMakefile const* mf = lg->GetMakefile();
  const std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
    "CMAKE_KATE_MAKE_ARGUMENTS");
  const char* homeOutputDir = lg->GetBinaryDirectory();

  fout <<
  "\t\"build\": {\n"
  "\t\t\"directory\": \"" << lg->GetBinaryDirectory() << "\",\n"
  "\t\t\"default_target\": \"all\",\n"
  "\t\t\"clean_target\": \"clean\",\n";

  // build, clean and quick are for the build plugin kate <= 4.12:
  fout << "\t\t\"build\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "all\",\n";
  fout << "\t\t\"clean\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "clean\",\n";
  fout << "\t\t\"quick\": \"" << make << " -C \\\"" << homeOutputDir
       << "\\\" " << makeArgs << " " << "install\",\n";

  // this is for kate >= 4.13:
  fout <<
  "\t\t\"targets\":[\n";

  this->AppendTarget(fout, "all", make, makeArgs,
                     homeOutputDir, homeOutputDir);
  this->AppendTarget(fout, "clean", make, makeArgs,
                     homeOutputDir, homeOutputDir);

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator
       it = this->GlobalGenerator->GetLocalGenerators().begin();
       it != this->GlobalGenerator->GetLocalGenerators().end();
       ++it)
    {
    const std::vector<cmGeneratorTarget*> targets =
        (*it)->GetGeneratorTargets();
    std::string currentDir = (*it)->GetCurrentBinaryDirectory();
    bool topLevel = (currentDir == (*it)->GetBinaryDirectory());

    for(std::vector<cmGeneratorTarget*>::const_iterator ti =
        targets.begin(); ti!=targets.end(); ++ti)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          bool insertTarget = false;
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (topLevel)
            {
            insertTarget = true;
            // only add the "edit_cache" target if it's not ccmake, because
            // this will not work within the IDE
            if (targetName == "edit_cache")
              {
              const char* editCommand = (*it)->GetMakefile()->GetDefinition
              ("CMAKE_EDIT_COMMAND");
              if (editCommand == 0)
                {
                insertTarget = false;
                }
              else if (strstr(editCommand, "ccmake")!=NULL)
                {
                insertTarget = false;
                }
              }
            }
          if (insertTarget)
            {
            this->AppendTarget(fout, targetName, make, makeArgs,
                               currentDir, homeOutputDir);
            }
        }
        break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
            || ((targetName.find("Continuous")==0)
                &&(targetName!="Continuous"))
            || ((targetName.find("Experimental")==0)
            && (targetName!="Experimental")))
            {
              break;
            }

            this->AppendTarget(fout, targetName, make, makeArgs,
                               currentDir, homeOutputDir);
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
        {
          this->AppendTarget(fout, targetName, make, makeArgs,
                             currentDir, homeOutputDir);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, make, makeArgs,
                             currentDir, homeOutputDir);

        }
        break;
        default:
          break;
      }
    }

    //insert rules for compiling, preprocessing and assembling individual files
    std::vector<std::string> objectFileTargets;
    (*it)->GetIndividualFileTargets(objectFileTargets);
    for(std::vector<std::string>::const_iterator fit=objectFileTargets.begin();
        fit != objectFileTargets.end();
        ++fit)
      {
      this->AppendTarget(fout, *fit, make, makeArgs, currentDir,homeOutputDir);
      }
  }

  fout <<
  "\t] }\n";
}